

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O1

void __thiscall
Ptex::v2_4::PtexReader::getPixel
          (PtexReader *this,int faceid,int u,int v,float *result,int firstchan,int nchannelsArg)

{
  DataType dt;
  int iVar1;
  code *pcVar2;
  long lVar3;
  float *dst;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  int numChannels;
  undefined1 *puVar7;
  undefined8 uStack_50;
  undefined1 auStack_48 [8];
  float *local_40;
  int local_38;
  int local_34;
  long *plVar6;
  
  uStack_50 = 0x10ae1a;
  local_40 = result;
  local_38 = v;
  local_34 = u;
  memset(result,0,(long)nchannelsArg << 2);
  numChannels = (uint)(this->_header).nchannels - firstchan;
  if (nchannelsArg < numChannels) {
    numChannels = nchannelsArg;
  }
  if (0 < numChannels) {
    uStack_50 = 0x10ae44;
    iVar5 = (*(this->super_PtexTexture)._vptr_PtexTexture[0x13])(this,faceid);
    iVar4 = local_34;
    iVar1 = local_38;
    plVar6 = (long *)CONCAT44(extraout_var,iVar5);
    lVar3 = -((long)this->_pixelsize + 0xfU & 0xfffffffffffffff0);
    puVar7 = auStack_48 + lVar3;
    pcVar2 = *(code **)(*plVar6 + 0x28);
    *(undefined8 *)(auStack_48 + lVar3 + -8) = 0x10ae71;
    (*pcVar2)(plVar6,iVar4,iVar1,puVar7);
    dst = local_40;
    dt = (this->_header).datatype;
    iVar1 = *(int *)(DataSize(Ptex::v2_4::DataType)::sizes + (ulong)dt * 4);
    if ((ulong)dt == 3) {
      *(undefined8 *)(auStack_48 + lVar3 + -8) = 0x10aea5;
      memcpy(dst,puVar7 + firstchan * iVar1,(long)(iVar1 * numChannels));
    }
    else {
      *(undefined8 *)(auStack_48 + lVar3 + -8) = 0x10aeb6;
      ConvertToFloat(dst,puVar7 + firstchan * iVar1,dt,numChannels);
    }
    pcVar2 = *(code **)(*plVar6 + 0x10);
    *(undefined8 *)(auStack_48 + lVar3 + -8) = 0x10aebf;
    (*pcVar2)(plVar6);
  }
  return;
}

Assistant:

void PtexReader::getPixel(int faceid, int u, int v,
                          float* result, int firstchan, int nchannelsArg)
{
    memset(result, 0, sizeof(*result)*nchannelsArg);

    // clip nchannels against actual number available
    nchannelsArg = PtexUtils::min(nchannelsArg, _header.nchannels-firstchan);
    if (nchannelsArg <= 0) return;

    // get raw pixel data
    PtexPtr<PtexFaceData> data ( getData(faceid) );
    void* pixel = alloca(_pixelsize);
    data->getPixel(u, v, pixel);

    // adjust for firstchan offset
    int datasize = DataSize(datatype());
    if (firstchan)
        pixel = (char*) pixel + datasize * firstchan;

    // convert/copy to result as needed
    if (datatype() == dt_float)
        memcpy(result, pixel, datasize * nchannelsArg);
    else
        ConvertToFloat(result, pixel, datatype(), nchannelsArg);
}